

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int doInstall(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  storage_type *psVar4;
  storage_type *psVar5;
  char **ppcVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QString local_68;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc == 0) {
    doInstall();
  }
  else {
    pcVar1 = *argv;
    iVar3 = strcmp(pcVar1,"qinstall");
    if (iVar3 == 0) {
      iVar3 = argc + -1;
      ppcVar6 = argv + 1;
      if (iVar3 == 3) {
        iVar3 = strcmp(*ppcVar6,"-exe");
        if (iVar3 != 0) {
          iVar3 = 3;
          goto LAB_002950c8;
        }
        ppcVar6 = argv + 2;
        bVar2 = true;
        iVar3 = 2;
      }
      else {
LAB_002950c8:
        bVar2 = false;
      }
      if (iVar3 == 2 || bVar2) {
        local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_48.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        if (*ppcVar6 == (char *)0x0) {
          psVar5 = (storage_type *)0x0;
        }
        else {
          psVar4 = (storage_type *)0xffffffffffffffff;
          do {
            psVar5 = psVar4 + 1;
            pcVar1 = *ppcVar6 + 1 + (long)psVar4;
            psVar4 = psVar5;
          } while (*pcVar1 != '\0');
        }
        QVar7.m_data = psVar5;
        QVar7.m_size = (qsizetype)&local_48;
        QString::fromLocal8Bit(QVar7);
        local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        if (ppcVar6[1] == (char *)0x0) {
          psVar5 = (storage_type *)0x0;
        }
        else {
          psVar4 = (storage_type *)0xffffffffffffffff;
          do {
            psVar5 = psVar4 + 1;
            pcVar1 = ppcVar6[1] + 1 + (long)psVar4;
            psVar4 = psVar5;
          } while (*pcVar1 != '\0');
        }
        QVar8.m_data = psVar5;
        QVar8.m_size = (qsizetype)&local_68;
        QString::fromLocal8Bit(QVar8);
        if (bVar2) {
          iVar3 = installFile(&local_48,&local_68,true,false);
        }
        else {
          iVar3 = installFileOrDirectory(&local_48,&local_68,false);
        }
        if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
        goto LAB_00295205;
      }
      doInstall();
    }
    else {
      fprintf(_stderr,"Error: unrecognized -install subcommand \'%s\'\n",pcVar1);
    }
  }
  iVar3 = 3;
LAB_00295205:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int doInstall(int argc, char **argv)
{
    if (!argc) {
        fprintf(stderr, "Error: -install requires further arguments\n");
        return 3;
    }
#ifdef Q_OS_WIN
    if (!strcmp(argv[0], "sed"))
        return doSed(argc - 1, argv + 1);
    if (!strcmp(argv[0], "ln"))
        return doLink(argc - 1, argv + 1);
#endif
    if (!strcmp(argv[0], "qinstall"))
        return doQInstall(argc - 1, argv + 1);
    fprintf(stderr, "Error: unrecognized -install subcommand '%s'\n", argv[0]);
    return 3;
}